

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hopBalance.c
# Opt level: O3

Hop_Obj_t *
Hop_NodeBalanceBuildSuper(Hop_Man_t *p,Vec_Ptr_t *vSuper,Hop_Type_t Type,int fUpdateLevel)

{
  Hop_Obj_t *pHVar1;
  Hop_Obj_t *pHVar2;
  void *pvVar3;
  bool bVar4;
  int iVar5;
  Hop_Obj_t *pHVar6;
  Hop_Obj_t *pHVar7;
  void **ppvVar8;
  Hop_Obj_t *pHVar9;
  long lVar10;
  uint uVar11;
  ulong uVar12;
  Hop_Obj_t *pHVar13;
  uint uVar14;
  Hop_Obj_t *pHVar15;
  uint uVar16;
  ulong uVar17;
  ulong uVar18;
  uint uVar19;
  
  if ((long)vSuper->nSize < 2) {
    __assert_fail("vSuper->nSize > 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/hop/hopBalance.c"
                  ,0xf7,
                  "Hop_Obj_t *Hop_NodeBalanceBuildSuper(Hop_Man_t *, Vec_Ptr_t *, Hop_Type_t, int)")
    ;
  }
  qsort(vSuper->pArray,(long)vSuper->nSize,8,Hop_NodeCompareLevelsDecrease);
  uVar16 = vSuper->nSize;
  uVar17 = (ulong)uVar16;
  if (1 < (int)uVar16) {
    do {
      uVar11 = 0;
      uVar16 = (uint)uVar17;
      if ((fUpdateLevel != 0) && (uVar11 = 0, uVar16 != 2)) {
        ppvVar8 = vSuper->pArray;
        uVar14 = *(uint *)(((ulong)ppvVar8[uVar17 - 2] & 0xfffffffffffffffe) + 0x20);
        uVar12 = (ulong)(uVar16 - 3) + 1;
        do {
          if (0x3f < (*(uint *)(((ulong)ppvVar8[uVar12 - 1] & 0xfffffffffffffffe) + 0x20) ^ uVar14))
          goto LAB_007b299d;
          uVar18 = uVar12 - 1;
          bVar4 = 0 < (long)uVar12;
          uVar12 = uVar18;
        } while (uVar18 != 0 && bVar4);
        uVar12 = 0;
LAB_007b299d:
        uVar11 = (uint)uVar12;
        if (uVar16 <= uVar11) goto LAB_007b2c9b;
        if (0x3f < (uVar14 ^ *(uint *)(((ulong)ppvVar8[uVar12 & 0xffffffff] & 0xfffffffffffffffe) +
                                      0x20))) {
          __assert_fail("Hop_ObjLevel(Hop_Regular(pObjLeft)) == Hop_ObjLevel(Hop_Regular(pObjRight))"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/hop/hopBalance.c"
                        ,0x12e,"int Hop_NodeBalanceFindLeft(Vec_Ptr_t *)");
        }
      }
      uVar14 = uVar16 - 2;
      if ((int)uVar14 < (int)uVar11) {
        __assert_fail("LeftBound <= RightBound",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/hop/hopBalance.c"
                      ,0x144,"void Hop_NodeBalancePermute(Hop_Man_t *, Vec_Ptr_t *, int, int)");
      }
      if (uVar14 != uVar11) {
        pHVar7 = (Hop_Obj_t *)vSuper->pArray[uVar17 - 1];
        pHVar15 = (Hop_Obj_t *)((ulong)pHVar7 & 0xfffffffffffffffe);
        if (p->pConst1 != pHVar15) {
          pHVar1 = (Hop_Obj_t *)vSuper->pArray[uVar14];
          uVar19 = uVar14;
          if (p->pConst1 != (Hop_Obj_t *)((ulong)pHVar1 & 0xfffffffffffffffe)) {
            do {
              if (((int)uVar19 < 0) || (uVar16 = vSuper->nSize, (int)uVar16 <= (int)uVar19))
              goto LAB_007b2c9b;
              pHVar2 = (Hop_Obj_t *)vSuper->pArray[uVar19];
              pHVar9 = (Hop_Obj_t *)((ulong)pHVar2 & 0xfffffffffffffffe);
              if (p->pConst1 == pHVar9) {
                vSuper->pArray[uVar19] = pHVar1;
LAB_007b2bc1:
                if ((int)uVar16 <= (int)uVar14) {
LAB_007b2d74:
                  __assert_fail("i >= 0 && i < p->nSize",
                                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                                ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
                }
                vSuper->pArray[uVar14] = pHVar2;
                goto LAB_007b29da;
              }
              if ((Type != AIG_EXOR) && ((*(uint *)&pHVar15->field_0x20 & 7) == 1)) {
                __assert_fail("Type != AIG_AND || !Hop_ObjIsConst1(Hop_Regular(p0))",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/hop/hop.h"
                              ,0xd3,
                              "Hop_Obj_t *Hop_ObjCreateGhost(Hop_Man_t *, Hop_Obj_t *, Hop_Obj_t *, Hop_Type_t)"
                             );
              }
              if (pHVar2 == (Hop_Obj_t *)0x0) {
                pHVar9 = (Hop_Obj_t *)0x0;
              }
              else if ((*(uint *)&pHVar9->field_0x20 & 7) == 1) {
                __assert_fail("p1 == NULL || !Hop_ObjIsConst1(Hop_Regular(p1))",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/hop/hop.h"
                              ,0xd4,
                              "Hop_Obj_t *Hop_ObjCreateGhost(Hop_Man_t *, Hop_Obj_t *, Hop_Obj_t *, Hop_Type_t)"
                             );
              }
              if (pHVar15 == pHVar9) {
                __assert_fail("Type == AIG_PI || Hop_Regular(p0) != Hop_Regular(p1)",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/hop/hop.h"
                              ,0xd5,
                              "Hop_Obj_t *Hop_ObjCreateGhost(Hop_Man_t *, Hop_Obj_t *, Hop_Obj_t *, Hop_Type_t)"
                             );
              }
              *(uint *)&(p->Ghost).field_0x20 =
                   (*(uint *)&(p->Ghost).field_0x20 & 0xfffffff8) + (Type == AIG_EXOR | 4);
              pHVar13 = pHVar7;
              pHVar6 = pHVar2;
              if (pHVar15->Id < pHVar9->Id) {
                pHVar13 = pHVar2;
                pHVar6 = pHVar7;
              }
              (p->Ghost).pFanin0 = pHVar6;
              (p->Ghost).pFanin1 = pHVar13;
              pHVar9 = Hop_TableLookup(p,&p->Ghost);
              if (pHVar9 != (Hop_Obj_t *)0x0) {
                uVar16 = vSuper->nSize;
                if (pHVar2 != pHVar1) {
                  if ((int)uVar16 <= (int)uVar19) goto LAB_007b2d74;
                  vSuper->pArray[uVar19] = pHVar1;
                  goto LAB_007b2bc1;
                }
                goto LAB_007b29d1;
              }
              bVar4 = (int)uVar11 < (int)uVar19;
              uVar19 = uVar19 - 1;
            } while (bVar4);
            uVar16 = vSuper->nSize;
          }
        }
      }
LAB_007b29d1:
      if ((int)uVar16 < 1) {
LAB_007b2cd9:
        __assert_fail("p->nSize > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                      ,0x2cc,"void *Vec_PtrPop(Vec_Ptr_t *)");
      }
LAB_007b29da:
      uVar11 = uVar16 - 1;
      vSuper->nSize = uVar11;
      if (uVar11 == 0) goto LAB_007b2cd9;
      pHVar7 = (Hop_Obj_t *)vSuper->pArray[uVar11];
      vSuper->nSize = uVar16 - 2;
      pHVar7 = Hop_Oper(p,pHVar7,(Hop_Obj_t *)vSuper->pArray[uVar16 - 2],Type);
      uVar16 = vSuper->nSize;
      uVar17 = (ulong)uVar16;
      if (0 < (int)uVar16) {
        uVar12 = 0;
        do {
          if ((Hop_Obj_t *)vSuper->pArray[uVar12] == pHVar7) goto LAB_007b2c75;
          uVar12 = uVar12 + 1;
        } while (uVar17 != uVar12);
      }
      if (uVar16 == vSuper->nCap) {
        if ((int)uVar16 < 0x10) {
          if (vSuper->pArray == (void **)0x0) {
            ppvVar8 = (void **)malloc(0x80);
          }
          else {
            ppvVar8 = (void **)realloc(vSuper->pArray,0x80);
          }
          vSuper->pArray = ppvVar8;
          vSuper->nCap = 0x10;
        }
        else {
          if (vSuper->pArray == (void **)0x0) {
            ppvVar8 = (void **)malloc(uVar17 << 4);
          }
          else {
            ppvVar8 = (void **)realloc(vSuper->pArray,uVar17 << 4);
          }
          vSuper->pArray = ppvVar8;
          vSuper->nCap = uVar16 * 2;
        }
      }
      else {
        ppvVar8 = vSuper->pArray;
      }
      uVar12 = (ulong)vSuper->nSize;
      uVar16 = vSuper->nSize + 1;
      uVar17 = (ulong)uVar16;
      vSuper->nSize = uVar16;
      ppvVar8[uVar12] = pHVar7;
      if ((long)uVar12 < 1) break;
      lVar10 = (ulong)uVar16 - 2;
      do {
        ppvVar8 = vSuper->pArray;
        pvVar3 = ppvVar8[uVar12 & 0xffffffff];
        if (*(uint *)(((ulong)pvVar3 & 0xfffffffffffffffe) + 0x20) >> 6 <=
            *(uint *)(((ulong)ppvVar8[lVar10] & 0xfffffffffffffffe) + 0x20) >> 6) break;
        ppvVar8[uVar12 & 0xffffffff] = ppvVar8[lVar10];
        vSuper->pArray[lVar10] = pvVar3;
        iVar5 = (int)uVar12;
        uVar12 = (ulong)(iVar5 - 1);
        lVar10 = lVar10 + -1;
      } while (1 < iVar5);
LAB_007b2c75:
      uVar16 = (uint)uVar17;
    } while (1 < (int)uVar16);
  }
  if (uVar16 == 1) {
    return (Hop_Obj_t *)*vSuper->pArray;
  }
LAB_007b2c9b:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

Hop_Obj_t * Hop_NodeBalanceBuildSuper( Hop_Man_t * p, Vec_Ptr_t * vSuper, Hop_Type_t Type, int fUpdateLevel )
{
    Hop_Obj_t * pObj1, * pObj2;
    int LeftBound;
    assert( vSuper->nSize > 1 );
    // sort the new nodes by level in the decreasing order
    Vec_PtrSort( vSuper, (int (*)(void))Hop_NodeCompareLevelsDecrease );
    // balance the nodes
    while ( vSuper->nSize > 1 )
    {
        // find the left bound on the node to be paired
        LeftBound = (!fUpdateLevel)? 0 : Hop_NodeBalanceFindLeft( vSuper );
        // find the node that can be shared (if no such node, randomize choice)
        Hop_NodeBalancePermute( p, vSuper, LeftBound, Type == AIG_EXOR );
        // pull out the last two nodes
        pObj1 = (Hop_Obj_t *)Vec_PtrPop(vSuper);
        pObj2 = (Hop_Obj_t *)Vec_PtrPop(vSuper);
        Hop_NodeBalancePushUniqueOrderByLevel( vSuper, Hop_Oper(p, pObj1, pObj2, Type) );
    }
    return (Hop_Obj_t *)Vec_PtrEntry(vSuper, 0);
}